

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O0

qint64 __thiscall QDeadlineTimer::rawRemainingTimeNSecs(QDeadlineTimer *this)

{
  long lVar1;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar2;
  longlong lVar3;
  QDeadlineTimer *in_RDI;
  long in_FS_OFFSET;
  qint64 r;
  QDeadlineTimer now;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = in_RDI->t1;
  lVar3 = std::numeric_limits<long_long>::min();
  if (lVar1 == lVar3) {
    local_28 = (undefined1 *)in_RDI->t1;
  }
  else {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    timerType(in_RDI);
    local_18 = (undefined1  [16])current((TimerType)((ulong)lVar1 >> 0x20));
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    eVar2 = qSubOverflow<long_long>(in_RDI->t1,local_18._0_8_,(longlong *)&local_20);
    if (eVar2) {
      local_28 = (undefined1 *)0xffffffffffffffff;
    }
    else {
      local_28 = local_20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (qint64)local_28;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QDeadlineTimer::rawRemainingTimeNSecs() const noexcept
{
    if (t1 == std::numeric_limits<qint64>::min())
        return t1;          // we'd saturate to this anyway

    QDeadlineTimer now = current(timerType());
    qint64 r;
    if (qSubOverflow(t1, now.t1, &r))
        return -1;      // any negative number is fine
    return r;
}